

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void mxx::custom_op<int>::custom_function<mxx::min<int>>
               (long param_1,long param_2,int *param_3,undefined8 *param_4)

{
  int iVar1;
  int i;
  long lVar2;
  void *__src;
  int iVar3;
  int inout_buf;
  int in_buf;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  undefined1 local_48 [4];
  undefined1 local_44 [4];
  long local_40;
  size_t local_38;
  
  if (1 < *param_3) {
    lVar2 = 0;
    do {
      iVar1 = *(int *)(param_2 + lVar2 * 4);
      iVar3 = *(int *)(param_1 + lVar2 * 4);
      if (iVar1 < iVar3) {
        iVar3 = iVar1;
      }
      *(int *)(param_2 + lVar2 * 4) = iVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)*param_3 + -1);
  }
  MPI_Type_get_true_extent(*param_4,&local_40,&local_38);
  iVar1 = *param_3;
  memcpy(local_44 + local_40,(void *)(param_1 + (long)iVar1 * 4 + -4),local_38);
  __src = (void *)(param_2 + (long)iVar1 * 4 + -4);
  memcpy(local_48 + local_40,__src,local_38);
  memcpy(__src,local_48 + local_40,local_38);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }